

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O3

void gpc_bckc(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  uVar2 = in->a;
  if ((int)uVar2 < 1) {
    iVar1 = back->ig;
    out->r = back->ir;
    out->g = iVar1;
    uVar2 = back->ib;
  }
  else if (uVar2 < 0xff) {
    dVar5 = (double)(int)uVar2 / 255.0;
    dVar3 = 1.0 - dVar5;
    dVar4 = sRGB_to_d[in->r] * dVar5 + back->dr * dVar3;
    if (dVar4 <= 0.0031308) {
      dVar4 = dVar4 * 12.92;
    }
    else {
      dVar4 = pow(dVar4,0.4166666666666667);
      dVar4 = dVar4 * 1.055 + -0.055;
    }
    dVar4 = floor(dVar4 * 255.0 + 0.5);
    out->r = (int)dVar4 & 0xff;
    dVar4 = sRGB_to_d[in->g] * dVar5 + back->dg * dVar3;
    if (dVar4 <= 0.0031308) {
      dVar4 = dVar4 * 12.92;
    }
    else {
      dVar4 = pow(dVar4,0.4166666666666667);
      dVar4 = dVar4 * 1.055 + -0.055;
    }
    dVar4 = floor(dVar4 * 255.0 + 0.5);
    out->g = (int)dVar4 & 0xff;
    dVar3 = dVar5 * sRGB_to_d[in->b] + dVar3 * back->db;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    uVar2 = (int)dVar3 & 0xff;
  }
  else {
    iVar1 = in->g;
    out->r = in->r;
    out->g = iVar1;
    uVar2 = in->b;
  }
  out->b = uVar2;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_bckc(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else if (in->a >= 255)
   {
      out->r = in->r;
      out->g = in->g;
      out->b = in->b;
   }

   else
   {
      double a = in->a / 255.;

      out->r = sRGB(sRGB_to_d[in->r] * a + back->dr * (1-a));
      out->g = sRGB(sRGB_to_d[in->g] * a + back->dg * (1-a));
      out->b = sRGB(sRGB_to_d[in->b] * a + back->db * (1-a));
   }

   out->a = 255;
}